

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O0

FUNCTION_RETURN verifySignature(char *stringToVerify,char *signatureB64)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  BIO *pBVar4;
  RSA *key;
  int *piVar5;
  EVP_PKEY *pkey_00;
  BIO_METHOD *type;
  BIO *append;
  EVP_MD_CTX *ctx;
  EVP_MD *type_00;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  double extraout_XMM0_Qa_08;
  double dVar6;
  FUNCTION_RETURN result;
  int en;
  uint len;
  BIO *biosig;
  BIO *encoded_signature;
  BIO *b64;
  uchar buffer [512];
  EVP_PKEY *pkey;
  RSA *rsa;
  BIO *bio;
  int func_ret;
  char *pubKey;
  EVP_MD_CTX *mdctx;
  char *signatureB64_local;
  char *stringToVerify_local;
  
  sVar3 = strlen(
                "-----BEGIN RSA PUBLIC KEY-----\nMIGJAoGBAK+I8TveeXM0FkO784JfjowumGRSH4WSavq3wuGo5hFGbLxW7TbWYaTs\nmmkcNQ9IAiOsKkeJZ09DGfZidpG0ezHCz+m6gWrTuOwYntHL+bdEoBminS2nbeNV\n0vBIwGfz/ZaapRJtp9nEy0SC1Zd536+MvILzjpaBeIM9orv9TILZAgMBAAE=\n-----END RSA PUBLIC KEY-----\n"
                );
  pBVar4 = BIO_new_mem_buf("-----BEGIN RSA PUBLIC KEY-----\nMIGJAoGBAK+I8TveeXM0FkO784JfjowumGRSH4WSavq3wuGo5hFGbLxW7TbWYaTs\nmmkcNQ9IAiOsKkeJZ09DGfZidpG0ezHCz+m6gWrTuOwYntHL+bdEoBminS2nbeNV\n0vBIwGfz/ZaapRJtp9nEy0SC1Zd536+MvILzjpaBeIM9orv9TILZAgMBAAE=\n-----END RSA PUBLIC KEY-----\n"
                           ,(int)sVar3);
  key = PEM_read_bio_RSAPublicKey(pBVar4,(RSA **)0x0,(undefined1 *)0x0,(void *)0x0);
  BIO_free(pBVar4);
  if (key == (RSA *)0x0) {
    piVar5 = __errno_location();
    dVar6 = extraout_XMM0_Qa;
    if (*piVar5 != 0) {
      piVar5 = __errno_location();
      strerror(*piVar5);
      dVar6 = extraout_XMM0_Qa_00;
    }
    _log(dVar6);
    stringToVerify_local._4_4_ = FUNC_RET_ERROR;
  }
  else {
    pkey_00 = EVP_PKEY_new();
    EVP_PKEY_assign(pkey_00,6,key);
    type = BIO_f_base64();
    pBVar4 = BIO_new(type);
    sVar3 = strlen(signatureB64);
    append = BIO_new_mem_buf(signatureB64,(int)sVar3);
    pBVar4 = BIO_push(pBVar4,append);
    BIO_set_flags(pBVar4,0x100);
    sVar3 = strlen(signatureB64);
    uVar1 = BIO_read(pBVar4,&b64,(int)sVar3);
    buffer[(ulong)uVar1 - 8] = '\0';
    BIO_free_all(pBVar4);
    ctx = (EVP_MD_CTX *)EVP_MD_CTX_new();
    if (ctx == (EVP_MD_CTX *)0x0) {
      free_resources((EVP_PKEY *)pkey_00,(EVP_MD_CTX *)0x0);
      piVar5 = __errno_location();
      dVar6 = extraout_XMM0_Qa_01;
      if (*piVar5 != 0) {
        piVar5 = __errno_location();
        strerror(*piVar5);
        dVar6 = extraout_XMM0_Qa_02;
      }
      _log(dVar6);
      stringToVerify_local._4_4_ = FUNC_RET_ERROR;
    }
    else {
      type_00 = EVP_sha256();
      iVar2 = EVP_DigestVerifyInit(ctx,(EVP_PKEY_CTX **)0x0,type_00,(ENGINE *)0x0,pkey_00);
      if (iVar2 == 1) {
        sVar3 = strlen(stringToVerify);
        iVar2 = EVP_DigestVerifyUpdate(ctx,stringToVerify,(long)(int)sVar3);
        if (iVar2 == 1) {
          iVar2 = EVP_DigestVerifyFinal(ctx,(uchar *)&b64,(ulong)uVar1);
          if (iVar2 != 1) {
            piVar5 = __errno_location();
            dVar6 = extraout_XMM0_Qa_07;
            if (*piVar5 != 0) {
              piVar5 = __errno_location();
              strerror(*piVar5);
              dVar6 = extraout_XMM0_Qa_08;
            }
            _log(dVar6);
          }
          stringToVerify_local._4_4_ = FUNC_RET_ERROR;
          if (iVar2 == 1) {
            stringToVerify_local._4_4_ = FUNC_RET_OK;
          }
          free_resources((EVP_PKEY *)pkey_00,(EVP_MD_CTX *)ctx);
        }
        else {
          piVar5 = __errno_location();
          dVar6 = extraout_XMM0_Qa_05;
          if (*piVar5 != 0) {
            piVar5 = __errno_location();
            strerror(*piVar5);
            dVar6 = extraout_XMM0_Qa_06;
          }
          _log(dVar6);
          free_resources((EVP_PKEY *)pkey_00,(EVP_MD_CTX *)ctx);
          stringToVerify_local._4_4_ = FUNC_RET_ERROR;
        }
      }
      else {
        piVar5 = __errno_location();
        dVar6 = extraout_XMM0_Qa_03;
        if (*piVar5 != 0) {
          piVar5 = __errno_location();
          strerror(*piVar5);
          dVar6 = extraout_XMM0_Qa_04;
        }
        _log(dVar6);
        free_resources((EVP_PKEY *)pkey_00,(EVP_MD_CTX *)ctx);
        stringToVerify_local._4_4_ = FUNC_RET_ERROR;
      }
    }
  }
  return stringToVerify_local._4_4_;
}

Assistant:

FUNCTION_RETURN verifySignature(const char* stringToVerify,
		const char* signatureB64) {
	EVP_MD_CTX *mdctx = NULL;
	const char *pubKey = PUBLIC_KEY;
	int func_ret = 0;

	BIO* bio = BIO_new_mem_buf((void*) (pubKey), strlen(pubKey));
	RSA *rsa = PEM_read_bio_RSAPublicKey(bio, NULL, NULL, NULL);
	BIO_free(bio);
	if (rsa == NULL) {
		LOG_ERROR("Error reading public key");
		return FUNC_RET_ERROR;
	}
	EVP_PKEY *pkey = EVP_PKEY_new();
	EVP_PKEY_assign_RSA(pkey, rsa);

	/*BIO* bo = BIO_new(BIO_s_mem());
	 BIO_write(bo, pubKey, strlen(pubKey));
	 RSA *key = 0;
	 PEM_read_bio_RSAPublicKey(bo, &key, 0, 0);
	 BIO_free(bo);*/

//RSA* rsa = EVP_PKEY_get1_RSA( key );
//RSA * pubKey = d2i_RSA_PUBKEY(NULL, <der encoded byte stream pointer>, <num bytes>);
	unsigned char buffer[512];
	BIO* b64 = BIO_new(BIO_f_base64());
	BIO* encoded_signature = BIO_new_mem_buf((void *) signatureB64,
			strlen(signatureB64));
	BIO* biosig = BIO_push(b64, encoded_signature);
	BIO_set_flags(biosig, BIO_FLAGS_BASE64_NO_NL); //Do not use newlines to flush buffer
	unsigned int len = BIO_read(biosig, (void *) buffer, strlen(signatureB64));
//Can test here if len == decodeLen - if not, then return an error
	buffer[len] = 0;

	BIO_free_all(biosig);

	/* Create the Message Digest Context */
	if (!(mdctx = EVP_MD_CTX_create())) {
		free_resources(pkey, mdctx);
		LOG_ERROR("Error creating context");
		return FUNC_RET_ERROR;
	}
	if (1 != EVP_DigestVerifyInit(mdctx, NULL, EVP_sha256(), NULL, pkey)) {
		LOG_ERROR("Error initializing digest");
		free_resources(pkey, mdctx);
		return FUNC_RET_ERROR;
	}
	int en = strlen(stringToVerify);
	func_ret = EVP_DigestVerifyUpdate(mdctx, stringToVerify, en);
	if (1 != func_ret) {
		LOG_ERROR("Error verifying digest %d", func_ret);
		free_resources(pkey, mdctx);
		return FUNC_RET_ERROR;
	}
	FUNCTION_RETURN result;
	func_ret = EVP_DigestVerifyFinal(mdctx, buffer, len);
	if (1 != func_ret) {
		LOG_ERROR("Error verifying digest %d", func_ret);
	}
	result = (1 == func_ret ? FUNC_RET_OK : FUNC_RET_ERROR);

	free_resources(pkey, mdctx);
	return result;
}